

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  undefined1 linkLineComputer [8];
  bool bVar3;
  undefined7 in_register_00000031;
  cmStateDirectory *stateDir;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  undefined1 local_f0 [8];
  cmAlphaNum local_e8;
  string local_b8;
  undefined1 local_98 [48];
  string local_68;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000031,relink) == 0) {
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              ((string *)(local_f0 + 8),&this->super_cmMakefileTargetGenerator);
    bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,(string *)(local_f0 + 8));
    std::__cxx11::string::~string((string *)(local_f0 + 8));
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_f0 + 8),"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                 (allocator<char> *)local_98);
      WriteDeviceLibraryRules(this,(string *)(local_f0 + 8),false);
      std::__cxx11::string::~string((string *)(local_f0 + 8));
    }
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)(local_f0 + 8),&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_68,pcVar1,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  local_e8.View_._M_len = (size_t)&DAT_00000006;
  local_e8.View_._M_str = "CMAKE_";
  local_98._0_8_ = local_68._M_string_length;
  local_98._8_8_ = local_68._M_dataplus._M_p;
  cmStrCat<char[22]>(&local_48,(cmAlphaNum *)(local_f0 + 8),(cmAlphaNum *)local_98,
                     (char (*) [22])"_CREATE_SHARED_MODULE");
  local_98._0_8_ = local_98 + 0x10;
  local_98._8_8_ = (_Base_ptr)0x0;
  local_98[0x10] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_98,&local_68);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"CMAKE_MODULE_LINKER_FLAGS",(allocator<char> *)local_f0);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_b8,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_98,(string *)(local_f0 + 8),&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  stateDir = (cmStateDirectory *)
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar2 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    stateDir = (cmStateDirectory *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_b8,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)(local_f0 + 8),(cmStateSnapshot *)&local_b8);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_f0,(cmOutputConverter *)this,stateDir);
  linkLineComputer = local_f0;
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)(local_f0 + 8),&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar2,(string *)local_98,pcVar1,
             (cmLinkLineComputer *)linkLineComputer,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  WriteLibraryRules(this,&local_48,(string *)local_98,relink);
  if (local_f0 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_f0)[1])();
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_MODULE");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}